

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aVaryingInterpolationTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Accuracy::InterpolationCase::iterate(InterpolationCase *this)

{
  float fVar1;
  float fVar2;
  GLfloat GVar3;
  GLfloat GVar4;
  Precision precision;
  TestContext *this_00;
  bool bVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  deBool dVar10;
  GLuint index;
  GLuint index_00;
  GLint GVar11;
  GLenum err;
  char *pcVar12;
  RenderTarget *pRVar13;
  NotSupportedError *this_01;
  mapped_type *this_02;
  RenderContext *pRVar14;
  ContextInfo *pCVar15;
  float *pfVar16;
  MessageBuilder *pMVar17;
  TestError *pTVar18;
  PixelFormat *colorFmt;
  string local_948;
  int local_924 [2];
  int score;
  int worstScoreDiff;
  int bestScoreDiff;
  SurfaceAccess local_8f0;
  undefined1 local_8d0 [8];
  Surface reference;
  Surface rendered;
  int coordLoc;
  int posLoc;
  int ndx;
  MessageBuilder local_710;
  Vector<float,_3> local_590;
  Vector<float,_3> local_584;
  Vector<float,_3> local_578;
  Vector<float,_3> local_56c;
  Vector<float,_3> local_560;
  Vector<float,_3> local_554;
  MessageBuilder local_548;
  float local_3c8 [2];
  float coords [12];
  undefined1 local_38c [8];
  Vec3 bias;
  undefined1 local_374 [8];
  Vec3 scale;
  float positions [16];
  Vec4 wCoord;
  string local_310;
  StringTemplate local_2f0;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  StringTemplate local_288;
  string local_268;
  ProgramSources local_248;
  undefined1 local_178 [8];
  ShaderProgram program;
  key_type local_a0;
  undefined1 local_80 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  templateParams;
  int viewportY;
  int viewportX;
  int viewportHeight;
  int viewportWidth;
  Random rnd;
  TestLog *log;
  InterpolationCase *this_local;
  
  rnd.m_rnd._8_8_ =
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pcVar12 = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(pcVar12);
  de::Random::Random((Random *)&viewportHeight,dVar6);
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = tcu::RenderTarget::getWidth(pRVar13);
  if (iVar7 < 0x80) {
LAB_00496eb8:
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
               ,0xa0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = tcu::RenderTarget::getHeight(pRVar13);
  if (iVar7 < 0x80) goto LAB_00496eb8;
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = tcu::RenderTarget::getWidth(pRVar13);
  iVar7 = de::Random::getInt((Random *)&viewportHeight,0,iVar7 + -0x80);
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = tcu::RenderTarget::getHeight(pRVar13);
  templateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       de::Random::getInt((Random *)&viewportHeight,0,iVar8 + -0x80);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_80);
  pcVar12 = glu::getPrecisionName(this->m_precision);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"PRECISION",
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  this_02 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_80,&local_a0);
  std::__cxx11::string::operator=((string *)this_02,pcVar12);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  pRVar14 = Context::getRenderContext((this->super_TestCase).m_context);
  pcVar12 = iterate::s_vertShaderTemplate;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,pcVar12,&local_2a9);
  tcu::StringTemplate::StringTemplate(&local_288,&local_2a8);
  tcu::StringTemplate::specialize
            (&local_268,&local_288,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_80);
  pcVar12 = iterate::s_fragShaderTemplate;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,pcVar12,(allocator<char> *)((long)wCoord.m_data + 0xf));
  tcu::StringTemplate::StringTemplate(&local_2f0,&local_310);
  tcu::StringTemplate::specialize
            (&local_2d0,&local_2f0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_80);
  glu::makeVtxFragSources(&local_248,&local_268,&local_2d0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_178,pRVar14,&local_248);
  glu::ProgramSources::~ProgramSources(&local_248);
  std::__cxx11::string::~string((string *)&local_2d0);
  tcu::StringTemplate::~StringTemplate(&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)((long)wCoord.m_data + 0xf));
  std::__cxx11::string::~string((string *)&local_268);
  tcu::StringTemplate::~StringTemplate(&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  glu::operator<<((TestLog *)rnd.m_rnd._8_8_,(ShaderProgram *)local_178);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_178);
  if (bVar5) {
    if ((this->m_projective & 1U) == 0) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(positions + 0xe),1.0,1.0,1.0,1.0);
    }
    else {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(positions + 0xe),1.3,0.8,0.6,2.0);
    }
    pfVar16 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(positions + 0xe));
    scale.m_data[1] = -*pfVar16;
    pfVar16 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(positions + 0xe));
    scale.m_data[2] = -*pfVar16;
    positions[0] = 0.0;
    pfVar16 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(positions + 0xe));
    positions[1] = *pfVar16;
    pfVar16 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(positions + 0xe));
    positions[2] = -*pfVar16;
    pfVar16 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(positions + 0xe));
    positions[3] = *pfVar16;
    positions[4] = 0.0;
    pfVar16 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(positions + 0xe));
    positions[5] = *pfVar16;
    pfVar16 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(positions + 0xe));
    positions[6] = *pfVar16;
    pfVar16 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(positions + 0xe));
    positions[7] = -*pfVar16;
    positions[8] = 0.0;
    pfVar16 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(positions + 0xe));
    positions[9] = *pfVar16;
    pfVar16 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(positions + 0xe));
    positions[10] = *pfVar16;
    pfVar16 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(positions + 0xe));
    positions[0xb] = *pfVar16;
    positions[0xc] = 0.0;
    pfVar16 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(positions + 0xe));
    positions[0xd] = *pfVar16;
    tcu::operator-((tcu *)(bias.m_data + 1),&this->m_max,&this->m_min);
    tcu::operator/((tcu *)local_374,1.0,(Vector<float,_3> *)(bias.m_data + 1));
    tcu::operator*((tcu *)(coords + 10),-1.0,&this->m_min);
    tcu::operator*((tcu *)local_38c,(Vector<float,_3> *)(coords + 10),(Vector<float,_3> *)local_374)
    ;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,0);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,0);
    local_3c8[0] = (0.0 - fVar1) / *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,1);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,1);
    local_3c8[1] = (0.5 - fVar1) / *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,2);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,2);
    coords[0] = (1.0 - fVar1) / *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,0);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,0);
    coords[1] = (0.5 - fVar1) / *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,1);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,1);
    coords[2] = (1.0 - fVar1) / *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,2);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,2);
    coords[3] = (0.5 - fVar1) / *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,0);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,0);
    coords[4] = (0.5 - fVar1) / *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,1);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,1);
    coords[5] = (0.0 - fVar1) / *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,2);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,2);
    coords[6] = (0.5 - fVar1) / *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,0);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,0);
    coords[7] = (1.0 - fVar1) / *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,1);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,1);
    coords[8] = (0.5 - fVar1) / *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,2);
    fVar1 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,2);
    coords[9] = (0.0 - fVar1) / *pfVar16;
    tcu::TestLog::operator<<
              (&local_548,(TestLog *)rnd.m_rnd._8_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar17 = tcu::MessageBuilder::operator<<(&local_548,(char (*) [12])"a_coords = ");
    tcu::Vector<float,_3>::Vector(&local_56c,0.0);
    tcu::operator-((tcu *)&local_560,&local_56c,(Vector<float,_3> *)local_38c);
    tcu::operator/((tcu *)&local_554,&local_560,(Vector<float,_3> *)local_374);
    pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_554);
    pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [5])" -> ");
    tcu::Vector<float,_3>::Vector(&local_590,1.0);
    tcu::operator-((tcu *)&local_584,&local_590,(Vector<float,_3> *)local_38c);
    tcu::operator/((tcu *)&local_578,&local_584,(Vector<float,_3> *)local_374);
    pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_578);
    tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_548);
    tcu::TestLog::operator<<
              (&local_710,(TestLog *)rnd.m_rnd._8_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar17 = tcu::MessageBuilder::operator<<(&local_710,(char (*) [11])"u_scale = ");
    pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(Vector<float,_3> *)local_374);
    tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_710);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&posLoc,(TestLog *)rnd.m_rnd._8_8_,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar17 = tcu::MessageBuilder::operator<<((MessageBuilder *)&posLoc,(char (*) [10])"u_bias = ");
    pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(Vector<float,_3> *)local_38c);
    tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&posLoc);
    do {
      dVar10 = ::deGetFalse();
      if ((dVar10 != 0) ||
         (bVar5 = isValidFloatVec<3>(this->m_precision,(Vector<float,_3> *)local_374), !bVar5)) {
        pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar18,(char *)0x0,"isValidFloatVec(m_precision, scale)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
                   ,0xe3);
        __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar10 = ::deGetFalse();
    } while (dVar10 != 0);
    do {
      dVar10 = ::deGetFalse();
      if ((dVar10 != 0) ||
         (bVar5 = isValidFloatVec<3>(this->m_precision,(Vector<float,_3> *)local_38c), !bVar5)) {
        pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar18,(char *)0x0,"isValidFloatVec(m_precision, bias)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
                   ,0xe4);
        __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar10 = ::deGetFalse();
    } while (dVar10 != 0);
    for (coordLoc = 0; coordLoc < 0xc; coordLoc = coordLoc + 1) {
      do {
        dVar10 = ::deGetFalse();
        if ((dVar10 != 0) || (bVar5 = isValidFloat(this->m_precision,local_3c8[coordLoc]), !bVar5))
        {
          pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar18,(char *)0x0,"isValidFloat(m_precision, coords[ndx])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
                     ,0xe7);
          __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar10 = ::deGetFalse();
      } while (dVar10 != 0);
      do {
        dVar10 = ::deGetFalse();
        if (dVar10 != 0) {
LAB_0049840a:
          pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar18,(char *)0x0,
                     "isValidFloat(m_precision, coords[ndx] * scale[ndx % 3] + bias[ndx % 3])",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
                     ,0xe8);
          __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        precision = this->m_precision;
        fVar1 = local_3c8[coordLoc];
        pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_374,coordLoc % 3);
        fVar2 = *pfVar16;
        pfVar16 = tcu::Vector<float,_3>::operator[]((Vector<float,_3> *)local_38c,coordLoc % 3);
        bVar5 = isValidFloat(precision,fVar1 * fVar2 + *pfVar16);
        if (!bVar5) goto LAB_0049840a;
        dVar10 = ::deGetFalse();
      } while (dVar10 != 0);
    }
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_178);
    index = glwGetAttribLocation(dVar6,"a_position");
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_178);
    index_00 = glwGetAttribLocation(dVar6,"a_coords");
    glwEnableVertexAttribArray(index);
    glwVertexAttribPointer(index,4,0x1406,'\0',0,scale.m_data + 1);
    glwEnableVertexAttribArray(index_00);
    glwVertexAttribPointer(index_00,3,0x1406,'\0',0,local_3c8);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_178);
    glwUseProgram(dVar6);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_178);
    GVar11 = glwGetUniformLocation(dVar6,"u_scale");
    pfVar16 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_374);
    GVar3 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_374);
    GVar4 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_374);
    glwUniform3f(GVar11,GVar3,GVar4,*pfVar16);
    dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_178);
    GVar11 = glwGetUniformLocation(dVar6,"u_bias");
    pfVar16 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_38c);
    GVar3 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_38c);
    GVar4 = *pfVar16;
    pfVar16 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_38c);
    glwUniform3f(GVar11,GVar3,GVar4,*pfVar16);
    err = glwGetError();
    glu::checkError(err,"After program setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/accuracy/es2aVaryingInterpolationTests.cpp"
                    ,0xfd);
    tcu::Surface::Surface((Surface *)&reference.m_pixels.m_cap,0x80,0x80);
    tcu::Surface::Surface((Surface *)local_8d0,0x80,0x80);
    glwViewport(iVar7,templateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,0x80,
                0x80);
    glwDrawElements(4,6,0x1403,iterate::indices);
    pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
    colorFmt = tcu::RenderTarget::getPixelFormat(pRVar13);
    tcu::SurfaceAccess::SurfaceAccess(&local_8f0,(Surface *)local_8d0,colorFmt);
    renderReference(&local_8f0,local_3c8,(Vec4 *)(positions + 0xe),(Vec3 *)local_374,
                    (Vec3 *)local_38c);
    pRVar14 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar8 = templateParams._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&worstScoreDiff,(Surface *)&reference.m_pixels.m_cap);
    glu::readPixels(pRVar14,iVar7,iVar8,(PixelBufferAccess *)&worstScoreDiff);
    score = 0x10;
    local_924[1] = 300;
    local_924[0] = tcu::measurePixelDiffAccuracy
                             ((TestLog *)rnd.m_rnd._8_8_,"Result","Image comparison result",
                              (Surface *)local_8d0,(Surface *)&reference.m_pixels.m_cap,0x10,300,
                              COMPARE_LOG_EVERYTHING);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    de::toString<int>(&local_948,local_924);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,pcVar12);
    std::__cxx11::string::~string((string *)&local_948);
    wCoord.m_data[2] = 1.4013e-45;
    tcu::Surface::~Surface((Surface *)local_8d0);
    tcu::Surface::~Surface((Surface *)&reference.m_pixels.m_cap);
    goto LAB_004989a5;
  }
  if (this->m_precision == PRECISION_HIGHP) {
    pCVar15 = Context::getContextInfo((this->super_TestCase).m_context);
    uVar9 = (*pCVar15->_vptr_ContextInfo[7])();
    if ((uVar9 & 1) != 0) goto LAB_004973fb;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Fragment highp not supported");
  }
  else {
LAB_004973fb:
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compile failed");
  }
  wCoord.m_data[2] = 1.4013e-45;
LAB_004989a5:
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_178);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_80);
  de::Random::~Random((Random *)&viewportHeight);
  return STOP;
}

Assistant:

InterpolationCase::IterateResult InterpolationCase::iterate (void)
{
	TestLog&		log				= m_testCtx.getLog();
	de::Random		rnd				(deStringHash(getName()));
	int				viewportWidth	= 128;
	int				viewportHeight	= 128;

	if (m_context.getRenderTarget().getWidth() < viewportWidth ||
		m_context.getRenderTarget().getHeight() < viewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	int				viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth()	- viewportWidth);
	int				viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight()	- viewportHeight);

	static const char* s_vertShaderTemplate =
		"attribute highp vec4 a_position;\n"
		"attribute ${PRECISION} vec3 a_coords;\n"
		"varying ${PRECISION} vec3 v_coords;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_coords = a_coords;\n"
		"}\n";
	static const char* s_fragShaderTemplate =
		"varying ${PRECISION} vec3 v_coords;\n"
		"uniform ${PRECISION} vec3 u_scale;\n"
		"uniform ${PRECISION} vec3 u_bias;\n"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_FragColor = vec4(v_coords * u_scale + u_bias, 1.0);\n"
		"}\n";

	map<string, string> templateParams;
	templateParams["PRECISION"] = glu::getPrecisionName(m_precision);

	glu::ShaderProgram program(m_context.getRenderContext(),
							   glu::makeVtxFragSources(tcu::StringTemplate(s_vertShaderTemplate).specialize(templateParams),
													   tcu::StringTemplate(s_fragShaderTemplate).specialize(templateParams)));
	log << program;
	if (!program.isOk())
	{
		if (m_precision == glu::PRECISION_HIGHP && !m_context.getContextInfo().isFragmentHighPrecisionSupported())
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Fragment highp not supported");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Position coordinates.
	Vec4 wCoord = m_projective ? Vec4(1.3f, 0.8f, 0.6f, 2.0f) : Vec4(1.0f, 1.0f, 1.0f, 1.0f);
	float positions[] =
	{
		-1.0f*wCoord.x(), -1.0f*wCoord.x(), 0.0f, wCoord.x(),
		-1.0f*wCoord.y(), +1.0f*wCoord.y(), 0.0f, wCoord.y(),
		+1.0f*wCoord.z(), -1.0f*wCoord.z(), 0.0f, wCoord.z(),
		+1.0f*wCoord.w(), +1.0f*wCoord.w(), 0.0f, wCoord.w()
	};

	// Coordinates for interpolation.
	tcu::Vec3 scale	= 1.0f / (m_max - m_min);
	tcu::Vec3 bias	= -1.0f*m_min*scale;
	float coords[] =
	{
		(0.0f - bias[0])/scale[0], (0.5f - bias[1])/scale[1], (1.0f - bias[2])/scale[2],
		(0.5f - bias[0])/scale[0], (1.0f - bias[1])/scale[1], (0.5f - bias[2])/scale[2],
		(0.5f - bias[0])/scale[0], (0.0f - bias[1])/scale[1], (0.5f - bias[2])/scale[2],
		(1.0f - bias[0])/scale[0], (0.5f - bias[1])/scale[1], (0.0f - bias[2])/scale[2]
	};

	log << TestLog::Message << "a_coords = " << ((tcu::Vec3(0.0f) - bias)/scale) << " -> " << ((tcu::Vec3(1.0f) - bias)/scale) << TestLog::EndMessage;
	log << TestLog::Message << "u_scale = " << scale << TestLog::EndMessage;
	log << TestLog::Message << "u_bias = " << bias << TestLog::EndMessage;

	// Verify that none of the inputs are denormalized / inf / nan.
	TCU_CHECK(isValidFloatVec(m_precision, scale));
	TCU_CHECK(isValidFloatVec(m_precision, bias));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(coords); ndx++)
	{
		TCU_CHECK(isValidFloat(m_precision, coords[ndx]));
		TCU_CHECK(isValidFloat(m_precision, coords[ndx] * scale[ndx % 3] + bias[ndx % 3]));
	}

	// Indices.
	static const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

	{
		const int	posLoc		= glGetAttribLocation(program.getProgram(), "a_position");
		const int	coordLoc	= glGetAttribLocation(program.getProgram(), "a_coords");

		glEnableVertexAttribArray(posLoc);
		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &positions[0]);

		glEnableVertexAttribArray(coordLoc);
		glVertexAttribPointer(coordLoc, 3, GL_FLOAT, GL_FALSE, 0, &coords[0]);
	}

	glUseProgram(program.getProgram());
	glUniform3f(glGetUniformLocation(program.getProgram(), "u_scale"), scale.x(), scale.y(), scale.z());
	glUniform3f(glGetUniformLocation(program.getProgram(), "u_bias"), bias.x(), bias.y(), bias.z());

	GLU_CHECK_MSG("After program setup");

	// Frames.
	tcu::Surface	rendered		(viewportWidth, viewportHeight);
	tcu::Surface	reference		(viewportWidth, viewportHeight);

	// Render with GL.
	glViewport(viewportX, viewportY, viewportWidth, viewportHeight);
	glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0]);

	// Render reference \note While GPU is hopefully doing our draw call.
	renderReference(SurfaceAccess(reference, m_context.getRenderTarget().getPixelFormat()), coords, wCoord, scale, bias);

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, rendered.getAccess());

	// Compute difference.
	const int		bestScoreDiff	= 16;
	const int		worstScoreDiff	= 300;
	int				score			= tcu::measurePixelDiffAccuracy(log, "Result", "Image comparison result", reference, rendered, bestScoreDiff, worstScoreDiff, tcu::COMPARE_LOG_EVERYTHING);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	return STOP;
}